

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

BOOL __thiscall
Js::RecyclableES5ArrayWalker::FetchItemAtIndex
          (RecyclableES5ArrayWalker *this,JavascriptArray *arrayObj,uint32 index,Var *value)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  ScriptContext *pSVar6;
  _func_int **pp_Var5;
  
  if (arrayObj == (JavascriptArray *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xd37,"(arrayObj)","arrayObj");
    if (!bVar2) goto LAB_008b7bf9;
    *puVar4 = 0;
  }
  if (value == (Var *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xd38,"(value)","value");
    if (!bVar2) {
LAB_008b7bf9:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    pSVar6 = (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.scriptContext;
    pp_Var5 = (arrayObj->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
    value = (Var *)0x0;
  }
  else {
    pSVar6 = (this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.scriptContext;
    pp_Var5 = (arrayObj->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
  }
  iVar3 = (*pp_Var5[0x26])(arrayObj,arrayObj,(ulong)index,value,pSVar6);
  return (BOOL)(iVar3 == 1);
}

Assistant:

BOOL RecyclableES5ArrayWalker::FetchItemAtIndex(Js::JavascriptArray* arrayObj, uint32 index, Var *value)
    {
        Assert(arrayObj);
        Assert(value);

        return arrayObj->GetItem(arrayObj, index, value, scriptContext);
    }